

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

string * __thiscall
flatbuffers::TokenToString_abi_cxx11_(string *__return_storage_ptr__,flatbuffers *this,int t)

{
  string *s;
  allocator local_11;
  
  if ((int)this < 0x100) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               _ZZN11flatbuffersL13TokenToStringB5cxx11EiE6tokens_rel +
               *(int *)(_ZZN11flatbuffersL13TokenToStringB5cxx11EiE6tokens_rel +
                       (ulong)((int)this - 0x100) * 4),&local_11);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string TokenToString(int t) {
  static const char *tokens[] = {
    #define FLATBUFFERS_TOKEN(NAME, VALUE, STRING) STRING,
      FLATBUFFERS_GEN_TOKENS(FLATBUFFERS_TOKEN)
    #undef FLATBUFFERS_TOKEN
    #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) IDLTYPE,
      FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
    #undef FLATBUFFERS_TD
  };
  if (t < 256) {  // A single ascii char token.
    std::string s;
    s.append(1, t);
    return s;
  } else {       // Other tokens.
    return tokens[t - 256];
  }
}